

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSelector.cpp
# Opt level: O3

void Kernel::LiteralSelector::ensureSomeColoredSelected(Clause *c,uint eligible)

{
  Literal *pLVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  uVar2 = *(ulong *)&c->field_0x38;
  uVar4 = uVar2 & 0x300000;
  if (uVar4 == 0x300000) {
    Clause::computeColor(c);
    uVar2 = *(ulong *)&c->field_0x38;
    uVar4 = (ulong)((uint)uVar2 & 0x300000);
  }
  if (uVar4 != 0) {
    uVar3 = (uint)(uVar2 >> 0x20);
    uVar5 = uVar3 & 0xfffff;
    if ((uVar2 & 0xfffff00000000) != 0) {
      lVar6 = 0;
      do {
        if (((c->_literals[lVar6]->super_Term).field_0xf & 0x30) != 0) {
          return;
        }
        lVar6 = lVar6 + 1;
      } while ((uVar3 & 0xfffff) != (uint)lVar6);
    }
    if (uVar5 < eligible) {
      do {
        if (((c->_literals[(int)uVar5]->super_Term).field_0xf & 0x30) != 0) {
          pLVar1 = c->_literals[uVar3 & 0xfffff];
          c->_literals[uVar3 & 0xfffff] = c->_literals[(int)uVar5];
          c->_literals[(int)uVar5] = pLVar1;
          *(ulong *)&c->field_0x38 =
               *(ulong *)&c->field_0x38 & 0xfff00000ffffffff | uVar2 + 0x100000000 & 0xfffff00000000
          ;
          Clause::notifyLiteralReorder(c);
          return;
        }
        uVar5 = uVar5 + 1;
      } while (eligible != uVar5);
    }
  }
  return;
}

Assistant:

void LiteralSelector::ensureSomeColoredSelected(Clause* c, unsigned eligible)
{
  if(c->color()==COLOR_TRANSPARENT) {
    //if no literal is colored, do nothing
    return;
  }

  unsigned selCnt=c->numSelected();

  for(unsigned i=0;i<selCnt;i++) {
    if((*c)[i]->color()!=COLOR_TRANSPARENT) {
      return;
    }
  }

  for(unsigned i=selCnt;i<eligible;i++) {
    if((*c)[i]->color()!=COLOR_TRANSPARENT) {
      swap((*c)[selCnt], (*c)[i]);
      c->setSelected(selCnt+1);
      return;
    }
  }

  ASS(eligible < c->length() || //the colored literals are not among the eligible ones ...
      c->splits());             // .. unless the color comes from the propositional part
}